

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_search.hpp
# Opt level: O0

search_result * __thiscall
cvs_rk::local_search::run_fixed_n_all_neighbors
          (local_search *this,vector<bool,_std::allocator<bool>_> *initial_solution)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulint uVar4;
  ostream *poVar5;
  size_type sVar6;
  search_result *in_RDI;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *pvVar7;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  *this_00;
  reference rVar8;
  pair<std::_Rb_tree_const_iterator<std::vector<bool,_std::allocator<bool>_>_>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<cvs_rk::mod_int<9223372036854775783UL>_>,_bool> pVar10;
  mod_int<9223372036854775783UL> c;
  iterator __end2;
  iterator __begin2;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *__range2;
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  distinct_rows;
  anon_class_1_0_00000001_for__M_key_compare comp;
  double new_HK;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  new_vec;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  sum;
  candidate_t new_C;
  vector<bool,_std::allocator<bool>_> B;
  ulint j1;
  ulint j0;
  bool local_max;
  candidate_t best_C;
  double C_HK;
  double best_HK;
  candidate_t C;
  ulint i;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  hashed_vec;
  int N;
  type in_stack_fffffffffffffb48;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  *in_stack_fffffffffffffb50;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  *in_stack_fffffffffffffb58;
  double *pdVar11;
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  *in_stack_fffffffffffffb60;
  search_result *this_01;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  _Rb_tree_const_iterator<cvs_rk::mod_int<9223372036854775783UL>_> in_stack_fffffffffffffb70;
  anon_class_1_0_00000001_for__M_key_compare *__comp;
  ostream *in_stack_fffffffffffffb80;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_stack_fffffffffffffb98;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffba0;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_stack_fffffffffffffbb0;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *in_stack_fffffffffffffbb8;
  matrix<cvs_rk::rk_function<9223372036854775783UL>_> *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc10;
  __normal_iterator<cvs_rk::mod_int<9223372036854775783UL>_*,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  local_318;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_310;
  anon_class_1_0_00000001_for__M_key_compare local_301 [81];
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_2b0;
  vector<bool,_std::allocator<bool>_> local_2a8 [2];
  _Base_ptr local_238;
  undefined1 local_230;
  _Self local_228;
  _Self local_220;
  reference local_218;
  reference local_208 [7];
  reference local_190;
  reference local_180;
  ulong local_170;
  ulong local_168;
  byte local_159;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_118;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_f8;
  _Base_ptr local_f0;
  undefined1 local_e8;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_b8 [2];
  reference local_88;
  ulong local_78;
  int local_1c;
  
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffc10,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  iVar3 = weight(in_stack_fffffffffffffba0);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x11f1ed)
  ;
  local_1c = iVar3;
  matrix<cvs_rk::rk_function<9223372036854775783UL>_>::hashed_rows(in_stack_fffffffffffffbd8);
  local_78 = 0;
  while( true ) {
    uVar1 = local_78;
    uVar4 = matrix<cvs_rk::rk_function<9223372036854775783UL>_>::n_columns
                      ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)0x11f239);
    if (uVar4 <= uVar1) break;
    rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb70._M_node,
                       CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
    local_88 = rVar8;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_88);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      matrix<cvs_rk::rk_function<9223372036854775783UL>_>::column
                ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)in_stack_fffffffffffffb50,
                 (ulint)in_stack_fffffffffffffb48);
      operator-(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
      std::
      vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ::operator=((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)in_stack_fffffffffffffb60,
                  (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                   *)in_stack_fffffffffffffb58);
      std::
      vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                 *)in_stack_fffffffffffffb60);
    }
    local_78 = local_78 + 1;
  }
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::
  pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
            ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              *)in_stack_fffffffffffffb70._M_node,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
              *)in_stack_fffffffffffffb60);
  pVar9 = std::
          set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          ::insert((set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)in_stack_fffffffffffffb70._M_node,
                   (value_type *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  local_f0 = (_Base_ptr)pVar9.first._M_node;
  local_e8 = pVar9.second;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  pvVar7 = (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)HK<cvs_rk::mod_int<9223372036854775783ul>>(in_stack_fffffffffffffbb0);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             *)in_stack_fffffffffffffb60);
  local_118 = pvVar7;
  local_f8 = pvVar7;
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::pair(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  local_159 = 0;
  while (((local_159 ^ 0xff) & 1) != 0) {
    local_159 = 1;
    local_168 = 0;
    while( true ) {
      uVar1 = local_168;
      uVar4 = matrix<cvs_rk::rk_function<9223372036854775783UL>_>::n_columns
                        ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)0x11f4a0);
      if (uVar4 <= uVar1) break;
      local_170 = 0;
      while( true ) {
        uVar1 = local_170;
        uVar4 = matrix<cvs_rk::rk_function<9223372036854775783UL>_>::n_columns
                          ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)0x11f4ec);
        if (uVar4 <= uVar1) break;
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffb70._M_node,
                           CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
        in_stack_fffffffffffffc10 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
        local_180 = rVar8;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_180);
        in_stack_fffffffffffffc0f = false;
        if (!bVar2) {
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             in_stack_fffffffffffffb70._M_node,
                             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          local_190 = rVar8;
          in_stack_fffffffffffffc0f = std::_Bit_reference::operator_cast_to_bool(&local_190);
        }
        if ((bool)in_stack_fffffffffffffc0f != false) {
          std::vector<bool,_std::allocator<bool>_>::vector
                    (in_stack_fffffffffffffc10,
                     (vector<bool,_std::allocator<bool>_> *)
                     CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
          std::
          pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
          ::
          pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_true>
                    (in_stack_fffffffffffffb50);
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             in_stack_fffffffffffffb70._M_node,
                             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          local_208[0] = rVar8;
          std::_Bit_reference::operator=(local_208,true);
          rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             in_stack_fffffffffffffb70._M_node,
                             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          local_218 = rVar8;
          std::_Bit_reference::operator=(&local_218,false);
          local_220._M_node =
               (_Base_ptr)
               std::
               set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::find((set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       *)in_stack_fffffffffffffb58,&in_stack_fffffffffffffb50->first);
          local_228._M_node =
               (_Base_ptr)
               std::
               set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::end((set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)in_stack_fffffffffffffb48);
          bVar2 = std::operator==(&local_220,&local_228);
          if (bVar2) {
            pVar9 = std::
                    set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ::insert((set<std::vector<bool,_std::allocator<bool>_>,_std::less<std::vector<bool,_std::allocator<bool>_>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              *)in_stack_fffffffffffffb70._M_node,
                             (value_type *)
                             CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
            local_238 = (_Base_ptr)pVar9.first._M_node;
            local_230 = pVar9.second;
            in_stack_fffffffffffffbb0 = local_b8;
            pvVar7 = matrix<cvs_rk::rk_function<9223372036854775783UL>_>::column
                               ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)
                                in_stack_fffffffffffffb50,(ulint)in_stack_fffffffffffffb48);
            operator+(pvVar7,in_stack_fffffffffffffbb0);
            matrix<cvs_rk::rk_function<9223372036854775783UL>_>::column
                      ((matrix<cvs_rk::rk_function<9223372036854775783UL>_> *)
                       in_stack_fffffffffffffb50,(ulint)in_stack_fffffffffffffb48);
            operator-(pvVar7,in_stack_fffffffffffffbb0);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
            ::
            pair<std::vector<bool,_std::allocator<bool>_>_&,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_&,_true>
                      ((pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                        *)in_stack_fffffffffffffb70._M_node,
                       (vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                       (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                        *)in_stack_fffffffffffffb60);
            in_stack_fffffffffffffba0 = local_2a8;
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
            ::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
            std::
            pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
            ::~pair(in_stack_fffffffffffffb50);
            std::
            vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
            in_stack_fffffffffffffb98 =
                 (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *)HK<cvs_rk::mod_int<9223372036854775783ul>>(in_stack_fffffffffffffbb0);
            std::
            vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)in_stack_fffffffffffffb60);
            local_2b0 = in_stack_fffffffffffffb98;
            if ((double)local_f8 <= (double)in_stack_fffffffffffffb98) {
              local_f8 = in_stack_fffffffffffffb98;
              std::
              pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
              ::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
            }
            std::
            vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)in_stack_fffffffffffffb60);
            std::
            vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)in_stack_fffffffffffffb60);
          }
          std::
          pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
          ::~pair(in_stack_fffffffffffffb50);
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)0x11f9d5);
        }
        local_170 = local_170 + 1;
      }
      local_168 = local_168 + 1;
    }
    local_159 = (double)local_f8 <= (double)local_118;
    if (!(bool)local_159) {
      std::
      pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
      ::operator=(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_118 = local_f8;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"Current best solution: H(K) = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)local_118);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    if ((local_159 & 1) != 0) {
      in_stack_fffffffffffffb80 =
           std::operator<<((ostream *)&std::cout,"Local maximum reached. Search terminated.");
      std::ostream::operator<<(in_stack_fffffffffffffb80,std::endl<char,std::char_traits<char>>);
    }
  }
  __comp = local_301;
  std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>::allocator
            ((allocator<cvs_rk::mod_int<9223372036854775783UL>_> *)0x11fb18);
  std::
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::set((set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
         *)in_stack_fffffffffffffb80,__comp,(allocator_type *)in_stack_fffffffffffffb70._M_node);
  std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>::~allocator
            ((allocator<cvs_rk::mod_int<9223372036854775783UL>_> *)0x11fb41);
  local_310 = local_b8;
  local_318._M_current =
       (mod_int<9223372036854775783UL> *)
       std::
       vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
       ::begin((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                *)in_stack_fffffffffffffb48);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::end((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
         *)in_stack_fffffffffffffb48);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cvs_rk::mod_int<9223372036854775783UL>_*,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                        *)in_stack_fffffffffffffb50,
                       (__normal_iterator<cvs_rk::mod_int<9223372036854775783UL>_*,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
                        *)in_stack_fffffffffffffb48);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<cvs_rk::mod_int<9223372036854775783UL>_*,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
    ::operator*(&local_318);
    pVar10 = std::
             set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             ::insert((set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                       *)in_stack_fffffffffffffb70._M_node,
                      (value_type *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
    in_stack_fffffffffffffb70 = pVar10.first._M_node;
    in_stack_fffffffffffffb6f = pVar10.second;
    __gnu_cxx::
    __normal_iterator<cvs_rk::mod_int<9223372036854775783UL>_*,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
    ::operator++(&local_318);
  }
  this_01 = in_RDI;
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffc10,
             (vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  in_RDI->HK = (double)local_118;
  pdVar11 = &in_RDI->H;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
            *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  this_00 = (pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
             *)H<cvs_rk::mod_int<9223372036854775783ul>>(in_stack_fffffffffffffbb0);
  *pdVar11 = (double)this_00;
  sVar6 = std::
          set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
          ::size((set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *)0x11fcc9);
  in_RDI->distinct_rows = (int)sVar6;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             *)this_01);
  std::
  set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nicolaprezza[P]cvs-rk/internal/local_search.hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~set((set<cvs_rk::mod_int<9223372036854775783UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_nicolaprezza[P]cvs_rk_internal_local_search_hpp:160:15),_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
          *)0x11fcf9);
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::~pair(this_00);
  std::
  pair<std::vector<bool,_std::allocator<bool>_>,_std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>
  ::~pair(this_00);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::~vector((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
             *)this_01);
  return in_RDI;
}

Assistant:

search_result run_fixed_n_all_neighbors(vector<bool> initial_solution){

		int N = weight(initial_solution);

		auto hashed_vec = M.hashed_rows();

		for(ulint i=0;i<M.n_columns();++i){

			//remove column from hashed vector
			if(not initial_solution[i]){

				hashed_vec = hashed_vec - M.column(i);

			}

		}

		candidate_t C = {

				initial_solution,
				hashed_vec

		};

		explored.insert(C.first);

		//best H(K): entropy of current solution
		double best_HK = HK<matrix_t::mod_int_t>(C.second);
		double C_HK = best_HK;

		candidate_t best_C = C;

		bool local_max = false;

		//proceed until a local maximum is reached
		while(not local_max){

			//init as true, then check all neighbors
			//if at least 1 neighbor improves the score
			//of C, then local_max = false
			local_max = true;

			//try all neighbors
			//the set of neighbors is built trying all possible O(L^2) combinations
			//of both a flip 0->1 and a flip 1->0
			for(ulint j0 = 0;j0<M.n_columns();++j0){//0->1

				for(ulint j1 = 0;j1<M.n_columns();++j1){//1->0

					if(not C.first[j0] and C.first[j1]){

						auto B = C.first;
						candidate_t new_C;		//neighbor

						B[j0] = true;
						B[j1] = false;

						assert(N==weight(B));

						if(explored.find(B) == explored.end()){

							explored.insert(B);

							auto sum = C.second + M.column(j0);	//sum j0-th column
							auto new_vec = sum-M.column(j1);	//subtract j1-th column

							//new candidate
							new_C = {
									B,
									new_vec
							};

							//compute counts entropy
							double new_HK = HK<matrix_t::mod_int_t>(new_C.second);

							//cout << new_HK << endl;

							if(new_HK>=best_HK){

								best_HK = new_HK;
								best_C = new_C;

							}

						}

					}

				}

			}//end neighbor search cycle

			//if at least 1 neighbor strictly improves
			//C's entropy, then C is not a local maximum
			local_max = best_HK <= C_HK;

			if(not local_max){
				C  = best_C;
				C_HK = best_HK;
			}

			cout << "Current best solution: H(K) = " << C_HK << endl;

			if(local_max){

				cout << "Local maximum reached. Search terminated." << endl;

			}

		}

		auto comp = [](matrix_t::mod_int_t x, matrix_t::mod_int_t y){ return x < y; };
		std::set<matrix_t::mod_int_t,decltype(comp)> distinct_rows(comp);

		for(auto c:C.second) distinct_rows.insert(c);

		return {C.first, C_HK, H<matrix_t::mod_int_t>(C.second), int(distinct_rows.size())};

	}